

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_mul_vec3(ShaderEvalContext *c)

{
  Vector<float,_3> local_50;
  Vector<float,_3> local_40;
  tcu local_34 [12];
  VecAccess<float,_4,_3> local_28;
  
  local_40.m_data[0] = c->in[0].m_data[2];
  local_40.m_data._4_8_ = *(undefined8 *)c->in[0].m_data;
  local_50.m_data[2] = c->in[1].m_data[0];
  local_50.m_data._0_8_ = *(undefined8 *)(c->in[1].m_data + 1);
  tcu::mul<float,3>(local_34,&local_40,&local_50);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_34);
  return;
}

Assistant:

void eval_selection_float	(ShaderEvalContext& c) { c.color.x()	= selection(c.in[0].z() > 0.0f,		c.in[1].x(),					c.in[2].y()); }